

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

void Pln_ManStop(Pln_Man_t *p)

{
  Vec_Que_t *__ptr;
  Vec_Flt_t *__ptr_00;
  
  Hsh_VecManStop(p->pHashC);
  Hsh_VecManStop(p->pHashM);
  __ptr = p->vQue;
  if (__ptr->pOrder != (int *)0x0) {
    free(__ptr->pOrder);
    __ptr->pOrder = (int *)0x0;
  }
  free(__ptr->pHeap);
  free(__ptr);
  __ptr_00 = p->vCounts;
  free(__ptr_00->pArray);
  free(__ptr_00);
  Vec_IntFree(p->vCoefs);
  Vec_IntFree(p->vTempC[0]);
  Vec_IntFree(p->vTempC[1]);
  Vec_IntFree(p->vTempM[0]);
  Vec_IntFree(p->vTempM[1]);
  Vec_IntFree(p->vTempM[2]);
  Vec_IntFree(p->vTempM[3]);
  free(p);
  return;
}

Assistant:

void Pln_ManStop( Pln_Man_t * p )
{
    Hsh_VecManStop( p->pHashC );
    Hsh_VecManStop( p->pHashM );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    Vec_IntFree( p->vCoefs );
    Vec_IntFree( p->vTempC[0] );
    Vec_IntFree( p->vTempC[1] );
    Vec_IntFree( p->vTempM[0] );
    Vec_IntFree( p->vTempM[1] );
    Vec_IntFree( p->vTempM[2] );
    Vec_IntFree( p->vTempM[3] );
    //Vec_IntFree( p->vOrder );
    ABC_FREE( p );
}